

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

int64_t msa_subsuu_s_df(uint32_t df,int64_t arg1,int64_t arg2)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong local_58;
  ulong local_50;
  int64_t min_int;
  int64_t max_int;
  uint64_t u_arg2;
  uint64_t u_arg1;
  int64_t arg2_local;
  int64_t arg1_local;
  ulong uStack_10;
  uint32_t df_local;
  
  cVar1 = (char)df;
  uVar2 = arg1 & 0xffffffffffffffffU >> (0x40U - (char)(1L << (cVar1 + 3U & 0x3f)) & 0x3f);
  uVar3 = arg2 & 0xffffffffffffffffU >> (0x40U - (char)(1L << (cVar1 + 3U & 0x3f)) & 0x3f);
  local_50 = (1L << ((char)(1L << (cVar1 + 3U & 0x3f)) - 1U & 0x3f)) - 1;
  uVar4 = 1L << ((char)(1L << (cVar1 + 3U & 0x3f)) - 1U & 0x3f);
  local_58 = -uVar4;
  if (uVar3 < uVar2) {
    if (uVar2 - uVar3 < local_50) {
      local_50 = uVar2 - uVar3;
    }
    uStack_10 = local_50;
  }
  else {
    if (uVar3 - uVar2 < uVar4) {
      local_58 = uVar2 - uVar3;
    }
    uStack_10 = local_58;
  }
  return uStack_10;
}

Assistant:

static inline int64_t msa_subsuu_s_df(uint32_t df, int64_t arg1, int64_t arg2)
{
    uint64_t u_arg1 = UNSIGNED(arg1, df);
    uint64_t u_arg2 = UNSIGNED(arg2, df);
    int64_t max_int = DF_MAX_INT(df);
    int64_t min_int = DF_MIN_INT(df);
    if (u_arg1 > u_arg2) {
        return u_arg1 - u_arg2 < (uint64_t)max_int ?
            (int64_t)(u_arg1 - u_arg2) :
            max_int;
    } else {
        return u_arg2 - u_arg1 < (uint64_t)(-min_int) ?
            (int64_t)(u_arg1 - u_arg2) :
            min_int;
    }
}